

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c2mir.c
# Opt level: O0

void process_init_field_designator
               (c2m_ctx_t c2m_ctx,node_t_conflict designator_member,type *container_type)

{
  init_object_t obj;
  init_object_t obj_00;
  type *ptVar1;
  size_t sVar2;
  bool bVar3;
  init_object_t local_78;
  undefined1 local_60 [16];
  anon_union_8_2_e4b0c9a5_for_u local_50;
  node_t_conflict local_48;
  node_t_conflict curr_member;
  init_object_t init_object;
  decl_t decl;
  type *container_type_local;
  node_t_conflict designator_member_local;
  c2m_ctx_t c2m_ctx_local;
  
  decl = (decl_t)container_type;
  if (designator_member->code != N_MEMBER) {
    __assert_fail("designator_member->code == N_MEMBER",
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/c2mir/c2mir.c"
                  ,0x1daa,"void process_init_field_designator(c2m_ctx_t, node_t, struct type *)");
  }
  while (sVar2 = VARR_init_object_tlength(c2m_ctx->init_object_path), sVar2 != 0) {
    VARR_init_object_tlast((init_object_t *)local_60,c2m_ctx->init_object_path);
    curr_member = (node_t_conflict)local_60._0_8_;
    init_object.container_type = (type *)local_60._8_8_;
    ptVar1 = init_object.container_type;
    init_object._8_8_ = local_50;
    init_object.container_type._0_4_ = (int)local_60._8_8_;
    bVar3 = (int)init_object.container_type == 0;
    init_object.container_type = ptVar1;
    if (((bVar3) ||
        (init_object.u = (anon_union_8_2_e4b0c9a5_for_u)(local_50.curr_member)->attr,
        init_object.u.curr_index == 0)) ||
       (*(char *)(*(long *)(init_object.u.curr_index + 0x40) + 0x1d) == '\0')) break;
    decl = (decl_t)local_60._0_8_;
    VARR_init_object_tpop(&local_78,c2m_ctx->init_object_path);
  }
  sVar2 = VARR_node_tlength(c2m_ctx->containing_anon_members);
  if (sVar2 != 0) {
    __assert_fail("VARR_LENGTH (node_t, containing_anon_members) == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/c2mir/c2mir.c"
                  ,0x1db6,"void process_init_field_designator(c2m_ctx_t, node_t, struct type *)");
  }
  init_object.u = (anon_union_8_2_e4b0c9a5_for_u)designator_member->attr;
  local_48 = *(node_t_conflict *)(init_object.u.curr_index + 0x48);
  while (local_48 != (node_t_conflict)0x0) {
    init_object.u = (anon_union_8_2_e4b0c9a5_for_u)local_48->attr;
    VARR_node_tpush(c2m_ctx->containing_anon_members,local_48);
    local_48 = *(node_t_conflict *)(init_object.u.curr_index + 0x48);
  }
  while (sVar2 = VARR_node_tlength(c2m_ctx->containing_anon_members), sVar2 != 0) {
    init_object._8_8_ = VARR_node_tpop(c2m_ctx->containing_anon_members);
    curr_member = (node_t_conflict)decl;
    init_object.container_type = (type *)((ulong)init_object.container_type & 0xffffffff00000000);
    obj._8_8_ = init_object.container_type;
    obj.container_type = (type *)decl;
    obj.u.curr_member = (node_t_conflict)init_object._8_8_;
    VARR_init_object_tpush(c2m_ctx->init_object_path,obj);
    init_object.u = *(anon_union_8_2_e4b0c9a5_for_u *)(init_object._8_8_ + 8);
    decl = *(decl_t *)(init_object.u.curr_index + 0x40);
  }
  init_object._8_8_ = get_adjacent_member(designator_member,0);
  curr_member = (node_t_conflict)decl;
  init_object.container_type = (type *)CONCAT44(init_object.container_type._4_4_,1);
  obj_00._8_8_ = init_object.container_type;
  obj_00.container_type = (type *)decl;
  obj_00.u.curr_member = (node_t_conflict)init_object._8_8_;
  VARR_init_object_tpush(c2m_ctx->init_object_path,obj_00);
  return;
}

Assistant:

static void process_init_field_designator (c2m_ctx_t c2m_ctx, node_t designator_member,
                                           struct type *container_type) {
  decl_t decl;
  init_object_t init_object;
  node_t curr_member;

  assert (designator_member->code == N_MEMBER);
  /* We can have *partial* path of containing anon members: pop them */
  while (VARR_LENGTH (init_object_t, init_object_path) != 0) {
    init_object = VARR_LAST (init_object_t, init_object_path);
    if (!init_object.field_designator_p || (decl = init_object.u.curr_member->attr) == NULL
        || !decl->decl_spec.type->unnamed_anon_struct_union_member_type_p) {
      break;
    }
    container_type = init_object.container_type;
    VARR_POP (init_object_t, init_object_path);
  }
  /* Now add *full* path to designator_member of containing anon members */
  assert (VARR_LENGTH (node_t, containing_anon_members) == 0);
  decl = designator_member->attr;
  for (curr_member = decl->containing_unnamed_anon_struct_union_member; curr_member != NULL;
       curr_member = decl->containing_unnamed_anon_struct_union_member) {
    decl = curr_member->attr;
    VARR_PUSH (node_t, containing_anon_members, curr_member);
  }
  while (VARR_LENGTH (node_t, containing_anon_members) != 0) {
    init_object.u.curr_member = VARR_POP (node_t, containing_anon_members);
    init_object.container_type = container_type;
    init_object.field_designator_p = FALSE;
    VARR_PUSH (init_object_t, init_object_path, init_object);
    container_type = (decl = init_object.u.curr_member->attr)->decl_spec.type;
  }
  init_object.u.curr_member = get_adjacent_member (designator_member, FALSE);
  init_object.container_type = container_type;
  init_object.field_designator_p = TRUE;
  VARR_PUSH (init_object_t, init_object_path, init_object);
}